

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

bool embree::endsWith(string *str,string *suffix)

{
  int iVar1;
  bool bVar2;
  undefined1 *local_30;
  size_t local_28;
  undefined1 local_20 [16];
  
  if (str->_M_string_length < suffix->_M_string_length ||
      str->_M_string_length == suffix->_M_string_length) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)str);
    if (local_28 == suffix->_M_string_length) {
      if (local_28 == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_30,(suffix->_M_dataplus)._M_p,local_28);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_30 != local_20) {
      operator_delete(local_30);
    }
  }
  return bVar2;
}

Assistant:

bool endsWith(std::string const &str, std::string const &suffix)
{
  if (str.length() <= suffix.length())
    return false;
  return str.substr(str.length() - suffix.length(), str.length() - 1) == suffix;
}